

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

mat44 * nifti_quatern_to_mat44
                  (mat44 *__return_storage_ptr__,float qb,float qc,float qd,float qx,float qy,
                  float qz,float dx,float dy,float dz,float qfac)

{
  double dVar1;
  double dVar2;
  double dVar3;
  longdouble lVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar1 = (double)qb;
  dVar2 = (double)qc;
  dVar3 = (double)qd;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 0xc) = 1.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 4) = 0.0;
  dVar5 = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  dVar11 = 1.0 - dVar5;
  if (_DAT_001143d0 <= (longdouble)dVar11) {
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
  }
  else {
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar11 = 0.0;
    dVar5 = 1.0 / dVar5;
    dVar1 = dVar1 * dVar5;
    dVar2 = dVar2 * dVar5;
    dVar3 = dVar3 * dVar5;
  }
  dVar5 = 1.0;
  if (0.0 < dz) {
    dVar10 = (double)dz;
  }
  else {
    dVar10 = 1.0;
  }
  uVar7 = (ulong)DAT_001143e0;
  if (qfac < 0.0) {
    dVar10 = (double)CONCAT44((uint)((ulong)dVar10 >> 0x20) ^ DAT_001143e0._4_4_,
                              SUB84(dVar10,0) ^ (uint)DAT_001143e0);
  }
  if (0.0 < dy) {
    dVar13 = (double)dy;
  }
  else {
    dVar13 = 1.0;
  }
  if (0.0 < dx) {
    dVar5 = (double)dx;
  }
  dVar9 = dVar11 * dVar11;
  dVar6 = (double)((ulong)dVar2 ^ uVar7) * dVar2;
  dVar12 = (double)((ulong)dVar3 ^ uVar7) * dVar3;
  __return_storage_ptr__->m[0][0] = (float)((dVar1 * dVar1 + dVar9 + dVar6 + dVar12) * dVar5);
  lVar4 = (longdouble)(dVar1 * dVar2 - dVar3 * dVar11);
  __return_storage_ptr__->m[0][1] = (float)((lVar4 + lVar4) * (longdouble)dVar13);
  lVar4 = (longdouble)(dVar1 * dVar3 + dVar2 * dVar11);
  __return_storage_ptr__->m[0][2] = (float)((lVar4 + lVar4) * (longdouble)dVar10);
  lVar4 = (longdouble)(dVar1 * dVar2 + dVar3 * dVar11);
  dVar8 = (double)(uVar7 ^ (ulong)dVar1) * dVar1;
  __return_storage_ptr__->m[1][0] = (float)((lVar4 + lVar4) * (longdouble)dVar5);
  __return_storage_ptr__->m[1][1] = (float)((dVar2 * dVar2 + dVar9 + dVar8 + dVar12) * dVar13);
  lVar4 = (longdouble)(dVar2 * dVar3 - dVar1 * dVar11);
  __return_storage_ptr__->m[1][2] = (float)((lVar4 + lVar4) * (longdouble)dVar10);
  lVar4 = (longdouble)(dVar1 * dVar3 - dVar2 * dVar11);
  __return_storage_ptr__->m[2][0] = (float)((lVar4 + lVar4) * (longdouble)dVar5);
  lVar4 = (longdouble)(dVar2 * dVar3 + dVar1 * dVar11);
  __return_storage_ptr__->m[2][1] = (float)((lVar4 + lVar4) * (longdouble)dVar13);
  __return_storage_ptr__->m[2][2] = (float)((dVar3 * dVar3 + dVar9 + dVar6 + dVar8) * dVar10);
  __return_storage_ptr__->m[0][3] = qx;
  __return_storage_ptr__->m[1][3] = qy;
  __return_storage_ptr__->m[2][3] = qz;
  return __return_storage_ptr__;
}

Assistant:

mat44 nifti_quatern_to_mat44( float qb, float qc, float qd,
                              float qx, float qy, float qz,
                              float dx, float dy, float dz, float qfac )
{
   mat44 R ;
   double a,b=qb,c=qc,d=qd , xd,yd,zd ;

   /* last row is always [ 0 0 0 1 ] */

   R.m[3][0]=R.m[3][1]=R.m[3][2] = 0.0f ; R.m[3][3]= 1.0f ;

   /* compute a parameter from b,c,d */

   a = 1.0l - (b*b + c*c + d*d) ;
   if( a < 1.e-7l ){                   /* special case */
     a = 1.0l / sqrt(b*b+c*c+d*d) ;
     b *= a ; c *= a ; d *= a ;        /* normalize (b,c,d) vector */
     a = 0.0l ;                        /* a = 0 ==> 180 degree rotation */
   } else{
     a = sqrt(a) ;                     /* angle = 2*arccos(a) */
   }

   /* load rotation matrix, including scaling factors for voxel sizes */

   xd = (dx > 0.0) ? dx : 1.0l ;       /* make sure are positive */
   yd = (dy > 0.0) ? dy : 1.0l ;
   zd = (dz > 0.0) ? dz : 1.0l ;

   if( qfac < 0.0 ) zd = -zd ;         /* left handedness? */

   R.m[0][0] = (float)( (a*a+b*b-c*c-d*d) * xd) ;
   R.m[0][1] = 2.0l * (b*c-a*d        ) * yd ;
   R.m[0][2] = 2.0l * (b*d+a*c        ) * zd ;
   R.m[1][0] = 2.0l * (b*c+a*d        ) * xd ;
   R.m[1][1] = (float)( (a*a+c*c-b*b-d*d) * yd) ;
   R.m[1][2] = 2.0l * (c*d-a*b        ) * zd ;
   R.m[2][0] = 2.0l * (b*d-a*c        ) * xd ;
   R.m[2][1] = 2.0l * (c*d+a*b        ) * yd ;
   R.m[2][2] = (float)( (a*a+d*d-c*c-b*b) * zd) ;

   /* load offsets */

   R.m[0][3] = qx ; R.m[1][3] = qy ; R.m[2][3] = qz ;

   return R ;
}